

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extreme_value_dist.hpp
# Opt level: O3

result_type_conflict1 __thiscall
trng::extreme_value_dist<float>::operator()(extreme_value_dist<float> *this,lcg64_shift *r)

{
  float fVar1;
  float fVar2;
  ulong uVar3;
  float fVar4;
  
  fVar1 = (this->P).theta_;
  fVar2 = (this->P).eta_;
  uVar3 = (r->S).r * (r->P).a + (r->P).b;
  (r->S).r = uVar3;
  uVar3 = uVar3 >> 0x11 ^ uVar3;
  uVar3 = uVar3 << 0x1f ^ uVar3;
  fVar4 = logf((float)(uVar3 >> 1 ^ uVar3 >> 9) * 1.0842019e-19 + 1.1920929e-07);
  fVar4 = logf(-fVar4);
  return fVar4 * fVar1 + fVar2;
}

Assistant:

TRNG_CUDA_ENABLE result_type operator()(R &r) {
      return P.eta() + P.theta() * math::ln(-math::ln(utility::uniformoo<result_type>(r)));
    }